

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emap.c
# Opt level: O2

void duckdb_je_emap_register_interior(tsdn_t *tsdn,emap_t *emap,edata_t *edata,szind_t szind)

{
  ulong *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong uVar7;
  rtree_leaf_elm_t *prVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uintptr_t addr;
  ulong key;
  rtree_ctx_t *ctx;
  rtree_ctx_t rtree_ctx_fallback;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar10 = (ulong)edata->e_addr & 0xfffffffffffff000;
  uVar4 = (edata->field_2).e_size_esn;
  uVar11 = uVar10 + 0x1000;
  prVar8 = (rtree_leaf_elm_t *)0x0;
  key = uVar11;
  do {
    if (((uVar4 & 0xfffffffffffff000) + uVar10) - 0x2000 < key) {
      return;
    }
    if (key == uVar11 || (key & 0x3fffffff) == 0) {
      uVar7 = key & 0xffffffffc0000000;
      uVar9 = (ulong)(((uint)(key >> 0x1e) & 0xf) << 4);
      puVar1 = (ulong *)((long)&ctx->cache[0].leafkey + uVar9);
      uVar9 = *(ulong *)((long)&ctx->cache[0].leafkey + uVar9);
      if (uVar9 == uVar7) {
        prVar8 = (rtree_leaf_elm_t *)((ulong)((uint)(key >> 9) & 0x1ffff8) + puVar1[1]);
      }
      else if (ctx->l2_cache[0].leafkey == uVar7) {
        prVar8 = ctx->l2_cache[0].leaf;
        ctx->l2_cache[0].leafkey = uVar9;
        ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
        *puVar1 = uVar7;
        puVar1[1] = (ulong)prVar8;
        prVar8 = (rtree_leaf_elm_t *)
                 ((long)&(prVar8->le_bits).repr + (ulong)((uint)(key >> 9) & 0x1ffff8));
      }
      else {
        for (lVar12 = 0x118; lVar12 != 0x188; lVar12 = lVar12 + 0x10) {
          if (*(ulong *)((long)ctx->cache + lVar12 + -8) == uVar7) {
            uVar5 = *(ulong *)((long)&ctx->cache[0].leafkey + lVar12);
            puVar2 = (undefined8 *)((long)ctx->cache + lVar12 + -0x18);
            uVar6 = puVar2[1];
            puVar3 = (undefined8 *)((long)ctx->cache + lVar12 + -8);
            *puVar3 = *puVar2;
            puVar3[1] = uVar6;
            *(ulong *)((long)ctx->cache + lVar12 + -0x18) = uVar9;
            *(ulong *)((long)(ctx->cache + -1) + lVar12) = puVar1[1];
            *puVar1 = uVar7;
            puVar1[1] = uVar5;
            prVar8 = (rtree_leaf_elm_t *)(((uint)(key >> 9) & 0x1ffff8) + uVar5);
            goto LAB_00e67d1b;
          }
        }
        prVar8 = duckdb_je_rtree_leaf_elm_lookup_hard(tsdn,&emap->rtree,ctx,key,true,false);
      }
    }
LAB_00e67d1b:
    (prVar8->le_bits).repr = (void *)(((ulong)szind << 0x30) + ((ulong)edata & 0xfffffffffffe) + 1);
    prVar8 = prVar8 + 1;
    key = key + 0x1000;
  } while( true );
}

Assistant:

void
emap_register_interior(tsdn_t *tsdn, emap_t *emap, edata_t *edata,
    szind_t szind) {
	EMAP_DECLARE_RTREE_CTX;

	assert(edata_slab_get(edata));
	assert(edata_state_get(edata) == extent_state_active);

	if (config_debug) {
		/* Making sure the boundary is registered already. */
		rtree_leaf_elm_t *elm_a, *elm_b;
		bool err = emap_rtree_leaf_elms_lookup(tsdn, emap, rtree_ctx,
		    edata, /* dependent */ true, /* init_missing */ false,
		    &elm_a, &elm_b);
		assert(!err);
		rtree_contents_t contents_a, contents_b;
		contents_a = rtree_leaf_elm_read(tsdn, &emap->rtree, elm_a,
		    /* dependent */ true);
		contents_b = rtree_leaf_elm_read(tsdn, &emap->rtree, elm_b,
		    /* dependent */ true);
		assert(contents_a.edata == edata && contents_b.edata == edata);
		assert(contents_a.metadata.slab && contents_b.metadata.slab);
	}

	rtree_contents_t contents;
	contents.edata = edata;
	contents.metadata.szind = szind;
	contents.metadata.slab = true;
	contents.metadata.state = extent_state_active;
	contents.metadata.is_head = false; /* Not allowed to access. */

	assert(edata_size_get(edata) > (2 << LG_PAGE));
	rtree_write_range(tsdn, &emap->rtree, rtree_ctx,
	    (uintptr_t)edata_base_get(edata) + PAGE,
	    (uintptr_t)edata_last_get(edata) - PAGE, contents);
}